

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::loadGraph(Graph *this)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  int iVar6;
  int iVar7;
  string val;
  fstream file;
  int aiStack_220 [124];
  
  val._M_dataplus._M_p = (pointer)&val.field_2;
  val._M_string_length = 0;
  val.field_2._M_local_buf[0] = '\0';
  std::fstream::fstream(&file,"graph.txt",_S_in);
  if (*(int *)((long)aiStack_220 + *(long *)(_file + -0x18)) == 0) {
    clearMatrix(this);
    std::operator>>((istream *)&file,(string *)&val);
    iVar3 = std::__cxx11::stoi(&val,(size_t *)0x0,10);
    this->num_of_vert = iVar3;
    if (iVar3 < 1) {
      std::operator<<((ostream *)&std::cerr,"Graph can\'t have less than 1 vertices");
      exit(1);
    }
    iVar7 = 0;
    while (iVar7 < iVar3) {
      for (iVar6 = 0; iVar6 < iVar3; iVar6 = iVar6 + 1) {
        std::operator>>((istream *)&file,(string *)&val);
        bVar2 = std::operator==(&val,"/");
        if (bVar2) {
          std::__cxx11::string::assign((char *)&val);
          iVar7 = iVar7 + 1;
          iVar6 = 0;
        }
        iVar4 = std::__cxx11::stoi(&val,(size_t *)0x0,10);
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::stoi(&val,(size_t *)0x0,10);
          piVar1 = this->adj_matrix[(long)iVar7 + -1] + (long)iVar4 + 0x31;
          *piVar1 = *piVar1 + 1;
        }
      }
    }
    createList(this);
    createPredList(this);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Error while opening the file");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::fstream::~fstream(&file);
  std::__cxx11::string::~string((string *)&val);
  return;
}

Assistant:

void Graph::loadGraph(){
   string val; int nv = 0; fstream file("graph.txt", ios::in);
   if(file.good()){
      this->clearMatrix();
      // reads number of vertices (first line)
      file >> val;
      nv = this->num_of_vert = stoi(val);
      if(nv < 1){
         cerr << "Graph can't have less than 1 vertices";
         exit(EXIT_FAILURE);
      }
      for(int i = 0; i < nv;){
         for(int j = 0; j < nv; j++){
            // read the number
            file >> val;
            // if end of number then go to next line(vertex),
            if(val == "/"){
               // set columns to zero, and empty our 'val' variable
               i++;
               j = 0;
               val = "0";
            }
            // if number is good then put '1' in the column which the number is pointing (number - 1, starting from 0)
            if(stoi(val) not_eq 0)
               this->adj_matrix[i][stoi(val) - 1] += 1;
         }
      }
      this->createList();
      this->createPredList();
   }else{
      cout << "Error while opening the file" << endl;
   }
   return void();
}